

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::(anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
               (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                *input,Property *output,string *err)

{
  double t;
  pointer pSVar1;
  bool bVar2;
  undefined1 extraout_AL;
  value_type *pvVar3;
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  *pvVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  storage_union local_930;
  long local_920;
  vector<int,_std::allocator<int>_> a;
  PrimVar pvar;
  Attribute attr;
  optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> aval;
  
  Attribute::Attribute(&attr);
  attr._variability = Varying;
  tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_();
  ::std::__cxx11::string::_M_assign((string *)&attr._type_name);
  ::std::__cxx11::string::_M_dispose();
  if (input->_blocked == true) {
    attr._var._blocked = true;
  }
  if ((input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&attr._paths,&input->_paths);
  }
  pvar._value.v_.vtable = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  pvar._value.v_.storage.dynamic = (void *)0x0;
  pvar._blocked = false;
  pvar._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pvar._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  pvar._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  pvar._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  pvar._ts._17_8_ = 0;
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
  optional(&aval,&input->_attrib);
  if (aval.has_value_ == true) {
    pvVar3 = nonstd::optional_lite::
             optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value(&aval);
    if (pvVar3->_blocked == true) {
      attr._var._blocked = true;
    }
    pvVar3 = nonstd::optional_lite::
             optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value(&aval);
    if (pvVar3->_has_value == true) {
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
      _0_1_ = 0;
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
      _1_7_ = 0;
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0;
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._1_7_ = 0;
      pvVar3 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value
                         (&aval);
      bVar2 = Animatable<std::vector<int,_std::allocator<int>_>_>::get_scalar(pvVar3,&a);
      if (bVar2) {
        linb::any::construct<std::vector<int,std::allocator<int>>const&>((any *)&local_930,&a);
        linb::any::operator=((any *)&pvar,(any *)&local_930);
        if (local_920 != 0) {
          (**(code **)(local_920 + 0x20))(&local_930);
        }
      }
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&a.super__Vector_base<int,_std::allocator<int>_>);
    }
    pvVar3 = nonstd::optional_lite::
             optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value(&aval);
    bVar2 = Animatable<std::vector<int,_std::allocator<int>_>_>::has_timesamples(pvVar3);
    if (bVar2) {
      pvVar3 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value
                         (&aval);
      pvVar4 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::get_samples(&pvVar3->_ts);
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
      _0_1_ = 0;
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
      _1_7_ = 0;
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0;
      a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._1_7_ = 0;
      lVar6 = 8;
      for (uVar5 = 0;
          pSVar1 = (pvVar4->
                   super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar5 < (ulong)(((long)(pvVar4->
                                 super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x28)
          ; uVar5 = uVar5 + 1) {
        t = *(double *)((long)pSVar1 + lVar6 + -8);
        linb::any::construct<std::vector<int,std::allocator<int>>const&>
                  ((any *)&local_930,(vector<int,_std::allocator<int>_> *)((long)&pSVar1->t + lVar6)
                  );
        tinyusdz::value::TimeSamples::add_sample((TimeSamples *)&a,t,(Value *)&local_930);
        if (local_920 != 0) {
          (**(code **)(local_920 + 0x20))(&local_930);
        }
        lVar6 = lVar6 + 0x28;
      }
      tinyusdz::value::TimeSamples::operator=(&pvar._ts,(TimeSamples *)&a);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&a);
    }
    pvVar3 = nonstd::optional_lite::
             optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value(&aval);
    if (pvVar3->_has_value == false) {
      pvVar3 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value
                         (&aval);
      bVar2 = Animatable<std::vector<int,_std::allocator<int>_>_>::has_timesamples(pvVar3);
      if (!bVar2) goto LAB_00292c7c;
    }
    Attribute::set_var(&attr,&pvar);
  }
LAB_00292c7c:
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
  ~optional(&aval);
  primvar::PrimVar::~PrimVar(&pvar);
  AttrMetas::operator=(&attr._metas,&input->_metas);
  Property::Property((Property *)&aval,&attr,false);
  Property::operator=(output,(Property *)&aval);
  Property::~Property((Property *)&aval);
  Attribute::~Attribute(&attr);
  return (bool)extraout_AL;
}

Assistant:

bool ToProperty(const TypedAttribute<Animatable<T>> &input, Property &output, std::string *err) {

  DCOUT("ToProperty ");
  (void)err;

  Attribute attr;

  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections" << input.has_connections());
  DCOUT("has_value " << input.has_value());
  DCOUT("is_blocked " << input.is_blocked());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    

    attr.set_connections(input.get_connections());
  }

  //DCOUT("has_default " << input.has_default());
  //DCOUT("has_timesamples " << input.has_timesamples());

  {
    primvar::PrimVar pvar;

    // Includes !authored()
    nonstd::optional<Animatable<T>> aval = input.get_value();
    if (aval) {

      if (aval.value().is_blocked()) {
        attr.set_blocked(true);
      }

      if (aval.value().has_value()) {
        T a;
        if (aval.value().get_default(&a)) {
          value::Value val(a);
          pvar.set_value(val);
        }
      }

      if (aval.value().has_timesamples()) {
        value::TimeSamples ts = ToTypelessTimeSamples(aval.value().get_timesamples());
        pvar.set_timesamples(ts);
      }

      if (aval.value().has_value() || aval.value().has_timesamples()) {
        attr.set_var(std::move(pvar));
      }

    } else {
      DCOUT("no animatable value.");
    }
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /*custom*/ false);

  return true;
}